

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffIf(NodeDiffComputer *this,IfStatement *lhs,IfStatement *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  
  iVar1 = diffNodes(this,&lhs->_cond->super_Node,&rhs->_cond->super_Node);
  iVar2 = iVar1;
  if ((iVar1 <= this->limit) &&
     (iVar2 = diffNodes(this,&lhs->_thenB->super_Node,&rhs->_thenB->super_Node),
     iVar2 <= this->limit)) {
    iVar3 = diffNodes(this,&lhs->_elseB->super_Node,&rhs->_elseB->super_Node);
    iVar4 = 0;
    if (iVar3 <= this->limit) {
      iVar4 = iVar2 + iVar1;
    }
    iVar2 = iVar4 + iVar3;
  }
  return iVar2;
}

Assistant:

int32_t diffIf(const IfStatement *lhs, const IfStatement *rhs) {

    int32_t condDiff = diffNodes(lhs->condition(), rhs->condition());

    if (condDiff > limit)
      return condDiff;

    int32_t thenDiff = diffNodes(lhs->thenBranch(), rhs->thenBranch());

    if (thenDiff > limit)
      return thenDiff;

    int32_t elseDiff = diffNodes(lhs->elseBranch(), rhs->elseBranch());

    if (elseDiff > limit)
      return elseDiff;

    return condDiff + thenDiff + elseDiff;
  }